

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestCamelCaseFieldNames::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *pcVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Arena *pAVar7;
  int line;
  Arena *arena;
  string_view value;
  string_view value_00;
  TestCamelCaseFieldNames *_this;
  TestCamelCaseFieldNames *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestCamelCaseFieldNames *)to_msg;
  local_28[0] = from_msg;
  pcVar4 = absl::lts_20250127::log_internal::
           Check_NEImpl<edition_unittest::TestCamelCaseFieldNames_const*,edition_unittest::TestCamelCaseFieldNames*>
                     ((TestCamelCaseFieldNames **)local_28,&local_30,"&from != _this");
  if (pcVar4 != (Nullable<const_char_*>)0x0) {
    line = 0x69fb;
LAB_009c17a4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,line,pcVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.repeatedprimitivefield_,
             (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.repeatedstringfield_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 3));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.repeatedenumfield_,
             (RepeatedField<int> *)&from_msg[4]._internal_metadata_);
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::MergeFrom
            (&(local_30->field_0)._impl_.repeatedmessagefield_,
             (RepeatedPtrField<edition_unittest::ForeignMessage> *)(from_msg + 6));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.repeatedstringpiecefield_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[7]._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.repeatedcordfield_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 9));
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      puVar5 = (undefined8 *)(from_msg[10]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar4 = (char *)*puVar5;
      sVar2 = puVar5[1];
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar7 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value._M_str = pcVar4;
      value._M_len = sVar2;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(local_30->field_0)._impl_.stringfield_,value,pAVar7);
    }
    if ((uVar1 & 2) != 0) {
      puVar5 = (undefined8 *)((ulong)from_msg[0xb]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar4 = (char *)*puVar5;
      sVar2 = puVar5[1];
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar7 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_00._M_str = pcVar4;
      value_00._M_len = sVar2;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(local_30->field_0)._impl_.stringpiecefield_,value_00,pAVar7);
    }
    if ((uVar1 & 4) != 0) {
      uVar3 = from_msg[0xb]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar7 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.cordfield_,(string *)(uVar3 & 0xfffffffffffffffc),
                 pAVar7);
    }
    if ((uVar1 & 8) != 0) {
      from_msg_00 = (MessageLite *)from_msg[0xc]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        pcVar4 = "from._impl_.messagefield_ != nullptr";
        line = 0x6a12;
        goto LAB_009c17a4;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0xb0);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>
                           (arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0xb0) = pvVar6;
      }
      else {
        edition_unittest::ForeignMessage::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      *(int *)((long)&local_30->field_0 + 0xb8) = (int)from_msg[0xc]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x20) != 0) {
      (local_30->field_0)._impl_.enumfield_ =
           *(int *)((long)&from_msg[0xc]._internal_metadata_.ptr_ + 4);
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestCamelCaseFieldNames::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestCamelCaseFieldNames*>(&to_msg);
  auto& from = static_cast<const TestCamelCaseFieldNames&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestCamelCaseFieldNames)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeatedprimitivefield()->MergeFrom(from._internal_repeatedprimitivefield());
  _this->_internal_mutable_repeatedstringfield()->MergeFrom(from._internal_repeatedstringfield());
  _this->_internal_mutable_repeatedenumfield()->MergeFrom(from._internal_repeatedenumfield());
  _this->_internal_mutable_repeatedmessagefield()->MergeFrom(
      from._internal_repeatedmessagefield());
  _this->_internal_mutable_repeatedstringpiecefield()->MergeFrom(from._internal_repeatedstringpiecefield());
  _this->_internal_mutable_repeatedcordfield()->MergeFrom(from._internal_repeatedcordfield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_stringfield(from._internal_stringfield());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_stringpiecefield(from._internal_stringpiecefield());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cordfield(from._internal_cordfield());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.messagefield_ != nullptr);
      if (_this->_impl_.messagefield_ == nullptr) {
        _this->_impl_.messagefield_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messagefield_);
      } else {
        _this->_impl_.messagefield_->MergeFrom(*from._impl_.messagefield_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.primitivefield_ = from._impl_.primitivefield_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.enumfield_ = from._impl_.enumfield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}